

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastReduceMatrix
               (Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Wec_t *vLevels,Vec_Int_t *vRes,int fSigned,
               int fCla)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int c;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  ulong uVar10;
  int NodeC;
  int NodeS;
  Vec_Wec_t *local_40;
  ulong local_38;
  
  uVar1 = vProds->nSize;
  if (uVar1 != vLevels->nSize) {
    __assert_fail("nSize == Vec_WecSize(vLevels)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x363,
                  "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                 );
  }
  uVar9 = 0;
  local_40 = vProds;
  uVar10 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar10 = uVar9;
  }
  while( true ) {
    iVar5 = (int)uVar10;
    if ((int)uVar9 == iVar5) break;
    uVar1 = (int)uVar9 + 1;
    local_38 = uVar9;
    while( true ) {
      pVVar7 = Vec_WecEntry(vProds,(int)uVar9);
      if (pVVar7->nSize < 3) break;
      iVar2 = Vec_IntPop(pVVar7);
      iVar3 = Vec_IntPop(pVVar7);
      c = Vec_IntPop(pVVar7);
      pVVar8 = Vec_WecEntry(vLevels,(int)uVar9);
      iVar4 = Vec_IntPop(pVVar8);
      iVar5 = Vec_IntPop(pVVar8);
      iVar6 = Vec_IntPop(pVVar8);
      Wlc_BlastFullAdder(pNew,iVar2,iVar3,c,&NodeC,&NodeS);
      vProds = local_40;
      if (iVar5 < iVar4) {
        iVar5 = iVar4;
      }
      if (iVar5 <= iVar6) {
        iVar5 = iVar6;
      }
      Wlc_IntInsert(pVVar7,pVVar8,NodeS,iVar5 + 2);
      pVVar7 = Vec_WecEntry(vProds,uVar1);
      pVVar8 = Vec_WecEntry(vLevels,uVar1);
      uVar9 = local_38;
      Wlc_IntInsert(pVVar7,pVVar8,NodeC,iVar5 + 1);
    }
    uVar9 = (ulong)uVar1;
  }
  iVar2 = 0;
  do {
    if (iVar2 == iVar5) {
      pVVar7 = Vec_WecEntry(vLevels,0);
      vRes->nSize = 0;
      pVVar7->nSize = 0;
      for (iVar2 = 0; iVar5 != iVar2; iVar2 = iVar2 + 1) {
        pVVar8 = Vec_WecEntry(vProds,iVar2);
        iVar3 = Vec_IntEntry(pVVar8,0);
        Vec_IntPush(vRes,iVar3);
        iVar3 = Vec_IntEntry(pVVar8,1);
        Vec_IntPush(pVVar7,iVar3);
      }
      Vec_IntPush(vRes,0);
      Vec_IntPush(pVVar7,0);
      if (fCla == 0) {
        Wlc_BlastAdder(pNew,vRes->pArray,pVVar7->pArray,vRes->nSize,0);
        return;
      }
      Wlc_BlastAdderCLA(pNew,vRes->pArray,pVVar7->pArray,vRes->nSize,fSigned,0);
      return;
    }
    pVVar7 = Vec_WecEntry(vProds,iVar2);
    while (pVVar7->nSize < 2) {
      Vec_IntPush(pVVar7,0);
    }
    iVar2 = iVar2 + 1;
  } while (pVVar7->nSize == 2);
  __assert_fail("Vec_IntSize(vProd) == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcBlast.c"
                ,0x389,
                "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
               );
}

Assistant:

void Wlc_BlastReduceMatrix( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Wec_t * vLevels, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Int_t * vLevel, * vProd;
    int i, NodeS, NodeC, LevelS, LevelC, Node1, Node2, Node3, Level1, Level2, Level3;
    int nSize = Vec_WecSize(vProds);
    assert( nSize == Vec_WecSize(vLevels) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd  = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            vLevel = Vec_WecEntry( vLevels, i );

            Level1 = Vec_IntPop( vLevel );
            Level2 = Vec_IntPop( vLevel );
            Level3 = Vec_IntPop( vLevel );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            LevelS = Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 ) + 2;
            LevelC = LevelS - 1;

            Wlc_IntInsert( vProd, vLevel, NodeS, LevelS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            vLevel = Vec_WecEntry( vLevels, i+1 );

            Wlc_IntInsert( vProd, vLevel, NodeC, LevelC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }
//    Vec_WecPrint( vProds, 0 );

    vLevel = Vec_WecEntry( vLevels, 0 );
    Vec_IntClear( vRes );
    Vec_IntClear( vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,   Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vLevel, Vec_IntEntry(vProd, 1) );
    }
    Vec_IntPush( vRes,   0 );
    Vec_IntPush( vLevel, 0 );

    if ( fCla )
        Wlc_BlastAdderCLA( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), Vec_IntSize(vRes), fSigned, 0 );
    else
        Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), Vec_IntSize(vRes), 0 );
}